

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O2

void cmSHA512_Internal_Transform(SHA_CTX *context,sha_word64 *data)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  cm_sha2_uint64_t cVar6;
  cm_sha2_uint64_t cVar7;
  cm_sha2_uint64_t cVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  cm_sha2_uint64_t cVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  
  uVar1 = (context->s512).state[0];
  uVar2 = (context->s512).state[1];
  uVar3 = (context->s512).state[2];
  uVar4 = (context->s1).bitcount;
  uVar5 = (context->s256).bitcount;
  cVar6 = (context->s512).state[5];
  cVar7 = (context->s512).state[6];
  cVar8 = (context->s512).state[7];
  lVar16 = 0;
  uVar12 = uVar1;
  uVar9 = uVar3;
  uVar11 = uVar2;
  uVar14 = uVar5;
  uVar19 = uVar4;
  cVar20 = cVar8;
  uVar15 = cVar6;
  uVar22 = cVar7;
  do {
    uVar21 = uVar22;
    uVar22 = uVar15;
    uVar15 = uVar14;
    uVar13 = uVar11;
    uVar18 = uVar9;
    uVar11 = uVar12;
    uVar12 = *(ulong *)((long)data + lVar16);
    uVar12 = uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
             (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
             (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 | (uVar12 & 0xff00) << 0x28 |
             uVar12 << 0x38;
    *(ulong *)((long)context + lVar16 + 0x50) = uVar12;
    lVar24 = ((uVar22 ^ uVar21) & uVar15 ^ uVar21) + cVar20 +
             ((uVar15 << 0x17 | uVar15 >> 0x29) ^
             (uVar15 << 0x2e | uVar15 >> 0x12) ^ (uVar15 << 0x32 | uVar15 >> 0xe)) + uVar12 +
             *(long *)((long)K512 + lVar16);
    uVar14 = uVar19 + lVar24;
    uVar12 = (uVar13 & uVar18 ^ (uVar13 ^ uVar18) & uVar11) +
             ((uVar11 << 0x19 | uVar11 >> 0x27) ^
             (uVar11 << 0x1e | uVar11 >> 0x22) ^ (uVar11 << 0x24 | uVar11 >> 0x1c)) + lVar24;
    lVar16 = lVar16 + 8;
    uVar9 = uVar13;
    uVar19 = uVar18;
    cVar20 = uVar21;
  } while (lVar16 != 0x80);
  lVar16 = 0x1e;
  do {
    uVar25 = uVar11;
    uVar23 = uVar22;
    uVar22 = uVar15;
    uVar15 = uVar14;
    uVar19 = uVar13;
    uVar11 = uVar12;
    uVar10 = (uint)lVar16;
    uVar12 = *(ulong *)((long)context + (ulong)(uVar10 - 0xd & 0xf) * 8 + 0x50);
    uVar9 = *(ulong *)((long)context + (ulong)(uVar10 & 0xf) * 8 + 0x50);
    lVar24 = *(long *)(K256 + lVar16 * 2 + 0x3c);
    uVar14 = (ulong)(uVar10 - 0xe & 0xf);
    lVar17 = (uVar12 >> 7 ^
             (uVar12 << 0x38 | uVar12 >> 8) ^ (uVar12 >> 1 | (ulong)((uVar12 & 1) != 0) << 0x3f)) +
             *(long *)((long)context + (ulong)(uVar10 - 5 & 0xf) * 8 + 0x50) +
             (uVar9 >> 6 ^ (uVar9 << 3 | uVar9 >> 0x3d) ^ (uVar9 << 0x2d | uVar9 >> 0x13)) +
             *(long *)((long)context + uVar14 * 8 + 0x50);
    *(long *)((long)context + uVar14 * 8 + 0x50) = lVar17;
    lVar17 = lVar17 + ((uVar22 ^ uVar23) & uVar15 ^ uVar23) + uVar21 +
                      ((uVar15 << 0x17 | uVar15 >> 0x29) ^
                      (uVar15 << 0x2e | uVar15 >> 0x12) ^ (uVar15 << 0x32 | uVar15 >> 0xe)) + lVar24
    ;
    uVar14 = uVar18 + lVar17;
    uVar12 = (uVar25 & uVar19 ^ (uVar25 ^ uVar19) & uVar11) +
             ((uVar11 << 0x19 | uVar11 >> 0x27) ^
             (uVar11 << 0x1e | uVar11 >> 0x22) ^ (uVar11 << 0x24 | uVar11 >> 0x1c)) + lVar17;
    lVar16 = lVar16 + 1;
    uVar13 = uVar25;
    uVar18 = uVar19;
    uVar21 = uVar23;
  } while (lVar16 != 0x5e);
  (context->s512).state[0] = uVar12 + uVar1;
  (context->s512).state[1] = uVar11 + uVar2;
  (context->s512).state[2] = uVar25 + uVar3;
  (context->s1).bitcount = uVar19 + uVar4;
  (context->s256).bitcount = uVar14 + uVar5;
  (context->s512).state[5] = uVar15 + cVar6;
  (context->s512).state[6] = uVar22 + cVar7;
  (context->s512).state[7] = uVar23 + cVar8;
  return;
}

Assistant:

void SHA512_Internal_Transform(SHA_CTX* context, const sha_word64* data) {
	sha_word64	a, b, c, d, e, f, g, h, s0, s1;
	sha_word64	T1, T2, *W512 = (sha_word64*)context->s512.buffer;
	int		j;

	/* Initialize registers with the prev. intermediate value */
	a = context->s512.state[0];
	b = context->s512.state[1];
	c = context->s512.state[2];
	d = context->s512.state[3];
	e = context->s512.state[4];
	f = context->s512.state[5];
	g = context->s512.state[6];
	h = context->s512.state[7];

	j = 0;
	do {
#if BYTE_ORDER == LITTLE_ENDIAN
		/* Convert TO host byte order */
		REVERSE64(*data++, W512[j]);
		/* Apply the SHA-512 compression function to update a..h */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] + W512[j];
#else /* BYTE_ORDER == LITTLE_ENDIAN */
		/* Apply the SHA-512 compression function to update a..h with copy */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] + (W512[j] = *data++);
#endif /* BYTE_ORDER == LITTLE_ENDIAN */
		T2 = Sigma0_512(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 16);

	do {
		/* Part of the message block expansion: */
		s0 = W512[(j+1)&0x0f];
		s0 = sigma0_512(s0);
		s1 = W512[(j+14)&0x0f];
		s1 =  sigma1_512(s1);

		/* Apply the SHA-512 compression function to update a..h */
		T1 = h + Sigma1_512(e) + Ch(e, f, g) + K512[j] +
		     (W512[j&0x0f] += s1 + W512[(j+9)&0x0f] + s0);
		T2 = Sigma0_512(a) + Maj(a, b, c);
		h = g;
		g = f;
		f = e;
		e = d + T1;
		d = c;
		c = b;
		b = a;
		a = T1 + T2;

		j++;
	} while (j < 80);

	/* Compute the current intermediate hash value */
	context->s512.state[0] += a;
	context->s512.state[1] += b;
	context->s512.state[2] += c;
	context->s512.state[3] += d;
	context->s512.state[4] += e;
	context->s512.state[5] += f;
	context->s512.state[6] += g;
	context->s512.state[7] += h;

	/* Clean up */
	a = b = c = d = e = f = g = h = T1 = T2 = 0;
}